

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.cpp
# Opt level: O1

DeviceFeatures *
Diligent::EnableDeviceFeatures
          (DeviceFeatures *__return_storage_ptr__,DeviceFeatures *SupportedFeatures,
          DeviceFeatures *RequestedFeatures)

{
  DEVICE_FEATURE_STATE DVar1;
  string _msg;
  string local_38;
  
  if ((SupportedFeatures->SeparablePrograms == DEVICE_FEATURE_STATE_ENABLED) &&
     (RequestedFeatures->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)) {
    FormatString<char[34]>(&local_38,(char (*) [34])"Can not disable SeparablePrograms");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_38._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  __return_storage_ptr__->UniformBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderResourceStaticArrays = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderResourceRuntimeArrays = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->WaveOp = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->InstanceDataStepRate = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->NativeFence = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TileShaders = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TransferQueueTimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->VariableRateShading = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->SparseResources = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->SubpassFramebufferFetch = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureComponentSwizzle = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureSubresourceViews = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->NativeMultiDraw = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->AsyncShaderCompilation = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->FormattedBuffers = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->DepthClamp = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->IndependentBlend = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->DualSourceBlend = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->MultiViewport = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureCompressionBC = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureCompressionETC2 = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->VertexPipelineUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->PixelUAVWritesAndAtomics = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TextureUAVExtendedFormats = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderFloat16 = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ResourceBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->UniformBuffer16BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderInputOutput16 = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderInt8 = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ResourceBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->UniformBuffer8BitAccess = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->SeparablePrograms = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ShaderResourceQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->WireframeFill = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->MultithreadedResourceCreation = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->ComputeShaders = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->GeometryShaders = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->Tessellation = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->MeshShaders = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->RayTracing = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->BindlessResources = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->OcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->BinaryOcclusionQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->TimestampQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->PipelineStatisticsQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->DurationQueries = DEVICE_FEATURE_STATE_DISABLED;
  __return_storage_ptr__->DepthBiasClamp = DEVICE_FEATURE_STATE_DISABLED;
  DVar1 = GetFeatureState(RequestedFeatures->SeparablePrograms,SupportedFeatures->SeparablePrograms,
                          "Separable programs are");
  __return_storage_ptr__->SeparablePrograms = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ShaderResourceQueries,
                          SupportedFeatures->ShaderResourceQueries,"Shader resource queries are");
  __return_storage_ptr__->ShaderResourceQueries = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->WireframeFill,SupportedFeatures->WireframeFill,
                          "Wireframe fill is");
  __return_storage_ptr__->WireframeFill = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->MultithreadedResourceCreation,
                          SupportedFeatures->MultithreadedResourceCreation,
                          "Multithreaded resource creation is");
  __return_storage_ptr__->MultithreadedResourceCreation = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ComputeShaders,SupportedFeatures->ComputeShaders,
                          "Compute shaders are");
  __return_storage_ptr__->ComputeShaders = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->GeometryShaders,SupportedFeatures->GeometryShaders,
                          "Geometry shaders are");
  __return_storage_ptr__->GeometryShaders = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->Tessellation,SupportedFeatures->Tessellation,
                          "Tessellation is");
  __return_storage_ptr__->Tessellation = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->MeshShaders,SupportedFeatures->MeshShaders,
                          "Mesh shaders are");
  __return_storage_ptr__->MeshShaders = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->RayTracing,SupportedFeatures->RayTracing,
                          "Ray tracing is");
  __return_storage_ptr__->RayTracing = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->BindlessResources,SupportedFeatures->BindlessResources,
                          "Bindless resources are");
  __return_storage_ptr__->BindlessResources = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->OcclusionQueries,SupportedFeatures->OcclusionQueries,
                          "Occlusion queries are");
  __return_storage_ptr__->OcclusionQueries = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->BinaryOcclusionQueries,
                          SupportedFeatures->BinaryOcclusionQueries,"Binary occlusion queries are");
  __return_storage_ptr__->BinaryOcclusionQueries = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->TimestampQueries,SupportedFeatures->TimestampQueries,
                          "Timestamp queries are");
  __return_storage_ptr__->TimestampQueries = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->PipelineStatisticsQueries,
                          SupportedFeatures->PipelineStatisticsQueries,
                          "Pipeline statistics queries are");
  __return_storage_ptr__->PipelineStatisticsQueries = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->DurationQueries,SupportedFeatures->DurationQueries,
                          "Duration queries are");
  __return_storage_ptr__->DurationQueries = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->DepthBiasClamp,SupportedFeatures->DepthBiasClamp,
                          "Depth bias clamp is");
  __return_storage_ptr__->DepthBiasClamp = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->DepthClamp,SupportedFeatures->DepthClamp,
                          "Depth clamp is");
  __return_storage_ptr__->DepthClamp = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->IndependentBlend,SupportedFeatures->IndependentBlend,
                          "Independent blend is");
  __return_storage_ptr__->IndependentBlend = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->DualSourceBlend,SupportedFeatures->DualSourceBlend,
                          "Dual-source blend is");
  __return_storage_ptr__->DualSourceBlend = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->MultiViewport,SupportedFeatures->MultiViewport,
                          "Multiviewport is");
  __return_storage_ptr__->MultiViewport = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->TextureCompressionBC,
                          SupportedFeatures->TextureCompressionBC,"BC texture compression is");
  __return_storage_ptr__->TextureCompressionBC = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->TextureCompressionETC2,
                          SupportedFeatures->TextureCompressionETC2,"ETC texture compression is");
  __return_storage_ptr__->TextureCompressionETC2 = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->VertexPipelineUAVWritesAndAtomics,
                          SupportedFeatures->VertexPipelineUAVWritesAndAtomics,
                          "Vertex pipeline UAV writes and atomics are");
  __return_storage_ptr__->VertexPipelineUAVWritesAndAtomics = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->PixelUAVWritesAndAtomics,
                          SupportedFeatures->PixelUAVWritesAndAtomics,
                          "Pixel UAV writes and atomics are");
  __return_storage_ptr__->PixelUAVWritesAndAtomics = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->TextureUAVExtendedFormats,
                          SupportedFeatures->TextureUAVExtendedFormats,
                          "Texture UAV extended formats are");
  __return_storage_ptr__->TextureUAVExtendedFormats = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ShaderFloat16,SupportedFeatures->ShaderFloat16,
                          "16-bit float shader operations are");
  __return_storage_ptr__->ShaderFloat16 = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ResourceBuffer16BitAccess,
                          SupportedFeatures->ResourceBuffer16BitAccess,
                          "16-bit resource buffer access is");
  __return_storage_ptr__->ResourceBuffer16BitAccess = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->UniformBuffer16BitAccess,
                          SupportedFeatures->UniformBuffer16BitAccess,
                          "16-bit uniform buffer access is");
  __return_storage_ptr__->UniformBuffer16BitAccess = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ShaderInputOutput16,
                          SupportedFeatures->ShaderInputOutput16,"16-bit shader inputs/outputs are")
  ;
  __return_storage_ptr__->ShaderInputOutput16 = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ShaderInt8,SupportedFeatures->ShaderInt8,
                          "8-bit int shader operations are");
  __return_storage_ptr__->ShaderInt8 = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ResourceBuffer8BitAccess,
                          SupportedFeatures->ResourceBuffer8BitAccess,
                          "8-bit resource buffer access is");
  __return_storage_ptr__->ResourceBuffer8BitAccess = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->UniformBuffer8BitAccess,
                          SupportedFeatures->UniformBuffer8BitAccess,
                          "8-bit uniform buffer access is");
  __return_storage_ptr__->UniformBuffer8BitAccess = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ShaderResourceStaticArrays,
                          SupportedFeatures->ShaderResourceStaticArrays,
                          "Shader resource static arrays are");
  __return_storage_ptr__->ShaderResourceStaticArrays = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->ShaderResourceRuntimeArrays,
                          SupportedFeatures->ShaderResourceRuntimeArrays,
                          "Shader resource runtime arrays are");
  __return_storage_ptr__->ShaderResourceRuntimeArrays = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->WaveOp,SupportedFeatures->WaveOp,"Wave operations are")
  ;
  __return_storage_ptr__->WaveOp = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->InstanceDataStepRate,
                          SupportedFeatures->InstanceDataStepRate,"Instance data step rate is");
  __return_storage_ptr__->InstanceDataStepRate = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->NativeFence,SupportedFeatures->NativeFence,
                          "Native fence is");
  __return_storage_ptr__->NativeFence = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->TileShaders,SupportedFeatures->TileShaders,
                          "Tile shaders are");
  __return_storage_ptr__->TileShaders = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->TransferQueueTimestampQueries,
                          SupportedFeatures->TransferQueueTimestampQueries,
                          "Timestamp queries in transfer queues are");
  __return_storage_ptr__->TransferQueueTimestampQueries = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->VariableRateShading,
                          SupportedFeatures->VariableRateShading,"Variable shading rate is");
  __return_storage_ptr__->VariableRateShading = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->SparseResources,SupportedFeatures->SparseResources,
                          "Sparse resources are");
  __return_storage_ptr__->SparseResources = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->SubpassFramebufferFetch,
                          SupportedFeatures->SubpassFramebufferFetch,"Subpass framebuffer fetch is")
  ;
  __return_storage_ptr__->SubpassFramebufferFetch = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->TextureComponentSwizzle,
                          SupportedFeatures->TextureComponentSwizzle,"Texture component swizzle is")
  ;
  __return_storage_ptr__->TextureComponentSwizzle = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->TextureSubresourceViews,
                          SupportedFeatures->TextureSubresourceViews,"Texture subresource views are"
                         );
  __return_storage_ptr__->TextureSubresourceViews = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->NativeMultiDraw,SupportedFeatures->NativeMultiDraw,
                          "Native multi-draw commands are");
  __return_storage_ptr__->NativeMultiDraw = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->AsyncShaderCompilation,
                          SupportedFeatures->AsyncShaderCompilation,"Async shader compilation is");
  __return_storage_ptr__->AsyncShaderCompilation = DVar1;
  DVar1 = GetFeatureState(RequestedFeatures->FormattedBuffers,SupportedFeatures->FormattedBuffers,
                          "Formatted buffers are");
  __return_storage_ptr__->FormattedBuffers = DVar1;
  return __return_storage_ptr__;
}

Assistant:

DeviceFeatures EnableDeviceFeatures(const DeviceFeatures& SupportedFeatures,
                                    const DeviceFeatures& RequestedFeatures) noexcept(false)
{
    if (SupportedFeatures.SeparablePrograms == DEVICE_FEATURE_STATE_ENABLED &&
        RequestedFeatures.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
    {
        LOG_INFO_MESSAGE("Can not disable SeparablePrograms");
    }

    DeviceFeatures EnabledFeatures;

    // clang-format off
    ENABLE_FEATURE(SeparablePrograms,                 "Separable programs are");
    ENABLE_FEATURE(ShaderResourceQueries,             "Shader resource queries are");
    ENABLE_FEATURE(WireframeFill,                     "Wireframe fill is");
    ENABLE_FEATURE(MultithreadedResourceCreation,     "Multithreaded resource creation is");
    ENABLE_FEATURE(ComputeShaders,                    "Compute shaders are");
    ENABLE_FEATURE(GeometryShaders,                   "Geometry shaders are");
    ENABLE_FEATURE(Tessellation,                      "Tessellation is");
    ENABLE_FEATURE(MeshShaders,                       "Mesh shaders are");
    ENABLE_FEATURE(RayTracing,                        "Ray tracing is");
    ENABLE_FEATURE(BindlessResources,                 "Bindless resources are");
    ENABLE_FEATURE(OcclusionQueries,                  "Occlusion queries are");
    ENABLE_FEATURE(BinaryOcclusionQueries,            "Binary occlusion queries are");
    ENABLE_FEATURE(TimestampQueries,                  "Timestamp queries are");
    ENABLE_FEATURE(PipelineStatisticsQueries,         "Pipeline statistics queries are");
    ENABLE_FEATURE(DurationQueries,                   "Duration queries are");
    ENABLE_FEATURE(DepthBiasClamp,                    "Depth bias clamp is");
    ENABLE_FEATURE(DepthClamp,                        "Depth clamp is");
    ENABLE_FEATURE(IndependentBlend,                  "Independent blend is");
    ENABLE_FEATURE(DualSourceBlend,                   "Dual-source blend is");
    ENABLE_FEATURE(MultiViewport,                     "Multiviewport is");
    ENABLE_FEATURE(TextureCompressionBC,              "BC texture compression is");
    ENABLE_FEATURE(TextureCompressionETC2,            "ETC texture compression is");
    ENABLE_FEATURE(VertexPipelineUAVWritesAndAtomics, "Vertex pipeline UAV writes and atomics are");
    ENABLE_FEATURE(PixelUAVWritesAndAtomics,          "Pixel UAV writes and atomics are");
    ENABLE_FEATURE(TextureUAVExtendedFormats,         "Texture UAV extended formats are");
    ENABLE_FEATURE(ShaderFloat16,                     "16-bit float shader operations are");
    ENABLE_FEATURE(ResourceBuffer16BitAccess,         "16-bit resource buffer access is");
    ENABLE_FEATURE(UniformBuffer16BitAccess,          "16-bit uniform buffer access is");
    ENABLE_FEATURE(ShaderInputOutput16,               "16-bit shader inputs/outputs are");
    ENABLE_FEATURE(ShaderInt8,                        "8-bit int shader operations are");
    ENABLE_FEATURE(ResourceBuffer8BitAccess,          "8-bit resource buffer access is");
    ENABLE_FEATURE(UniformBuffer8BitAccess,           "8-bit uniform buffer access is");
    ENABLE_FEATURE(ShaderResourceStaticArrays,        "Shader resource static arrays are");
    ENABLE_FEATURE(ShaderResourceRuntimeArrays,       "Shader resource runtime arrays are");
    ENABLE_FEATURE(WaveOp,                            "Wave operations are");
    ENABLE_FEATURE(InstanceDataStepRate,              "Instance data step rate is");
    ENABLE_FEATURE(NativeFence,                       "Native fence is");
    ENABLE_FEATURE(TileShaders,                       "Tile shaders are");
    ENABLE_FEATURE(TransferQueueTimestampQueries,     "Timestamp queries in transfer queues are");
    ENABLE_FEATURE(VariableRateShading,               "Variable shading rate is");
    ENABLE_FEATURE(SparseResources,                   "Sparse resources are");
    ENABLE_FEATURE(SubpassFramebufferFetch,           "Subpass framebuffer fetch is");
    ENABLE_FEATURE(TextureComponentSwizzle,           "Texture component swizzle is");
    ENABLE_FEATURE(TextureSubresourceViews,           "Texture subresource views are");
    ENABLE_FEATURE(NativeMultiDraw,                   "Native multi-draw commands are");
    ENABLE_FEATURE(AsyncShaderCompilation,            "Async shader compilation is");
    ENABLE_FEATURE(FormattedBuffers,                  "Formatted buffers are");
    // clang-format on

    ASSERT_SIZEOF(DeviceFeatures, 47, "Did you add a new feature to DeviceFeatures? Please handle its status here (if necessary).");

    return EnabledFeatures;
}